

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_getcdromdirs(char *args)

{
  long *plVar1;
  undefined8 uVar2;
  long *local_28;
  char **i;
  int dir_count;
  char **rc;
  char *args_local;
  
  plVar1 = (long *)PHYSFS_getCdRomDirs();
  if (plVar1 == (long *)0x0) {
    uVar2 = PHYSFS_getLastError();
    printf("Failure. Reason: [%s].\n",uVar2);
  }
  else {
    i._4_4_ = 0;
    for (local_28 = plVar1; *local_28 != 0; local_28 = local_28 + 1) {
      printf("%s\n",*local_28);
      i._4_4_ = i._4_4_ + 1;
    }
    printf("\n total (%d) drives.\n",(ulong)i._4_4_);
    PHYSFS_freeList(plVar1);
  }
  return 1;
}

Assistant:

static int cmd_getcdromdirs(char *args)
{
    char **rc = PHYSFS_getCdRomDirs();

    if (rc == NULL)
        printf("Failure. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        int dir_count;
        char **i;
        for (i = rc, dir_count = 0; *i != NULL; i++, dir_count++)
            printf("%s\n", *i);

        printf("\n total (%d) drives.\n", dir_count);
        PHYSFS_freeList(rc);
    } /* else */

    return 1;
}